

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintserialize.h
# Opt level: O0

ssize_t bsplib::UIntSerialize<int>::read(int __fd,void *__buf,size_t __nbytes)

{
  byte bVar1;
  uint uVar2;
  undefined4 in_register_0000003c;
  undefined4 local_24;
  int power;
  uchar c;
  uchar m;
  int i;
  int *x_local;
  uchar *cs_local;
  
  *(undefined4 *)__buf = 0;
  power = 0;
  local_24 = 1;
  do {
    uVar2 = power + 1;
    bVar1 = *(byte *)(CONCAT44(in_register_0000003c,__fd) + (long)power);
    *(uint *)__buf = local_24 * (bVar1 & 0x7f) + *__buf;
    local_24 = local_24 << 7;
    power = uVar2;
  } while ((bVar1 & 0x80) != 0);
  return (ulong)uVar2;
}

Assistant:

static int read( const unsigned char * cs, UInt & x ) {
        x = 0;
        int i = 0;
        unsigned char m = (1 << (CHAR_BIT-1));
        unsigned char c = 0;
        UInt power = 1;
        do {
            c = cs[i++];
            x += power * (c & (m-1));
            power <<= (CHAR_BIT-1);
        } while (c & m);

        return i;
    }